

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O3

string * http::Page::HTMLEncode(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  string *psVar2;
  ulong uVar3;
  char *pcVar4;
  string rc;
  stringstream ss;
  char local_1e1;
  string *local_1e0;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  local_1c8 = 0;
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (str->_M_string_length != 0) {
    uVar3 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar3];
      pcVar4 = "&gt";
      if (cVar1 == '>') {
LAB_00104bd3:
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar4,3);
      }
      else {
        if (cVar1 == '<') {
          pcVar4 = "&lt";
          goto LAB_00104bd3;
        }
        local_1e1 = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1e1,1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < str->_M_string_length);
  }
  psVar2 = local_1e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
  }
  return psVar2;
}

Assistant:

std::string http::Page::HTMLEncode(const std::string& str)
{
    std::string rc;
    std::stringstream ss;
    for (size_t i = 0; i < str.size(); i++)
    {
        switch (str[i])
        {
        case '<': ss << "&lt"; break;

        case '>': ss << "&gt"; break;

        default: ss << str[i]; break;
        }
    }
    return ss.str();
}